

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O3

string * __thiscall
enact::AstSerialise::visitEnumStmt_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,EnumStmt *stmt)

{
  pointer pVVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  Variant *variant;
  pointer pVVar4;
  stringstream s;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(Stmt::Enum ",0xc);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(stmt->name).lexeme._M_dataplus._M_p,
                      (stmt->name).lexeme._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,") (\n",4);
  std::__cxx11::string::append((char *)&this->m_ident);
  pVVar1 = (stmt->variants).
           super__Vector_base<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pVVar4 = (stmt->variants).
                super__Vector_base<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>
                ._M_impl.super__Vector_impl_data._M_start; pVVar4 != pVVar1; pVVar4 = pVVar4 + 1) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(this->m_ident)._M_dataplus._M_p,(this->m_ident)._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(pVVar4->name).lexeme._M_dataplus._M_p,
                        (pVVar4->name).lexeme._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    iVar2 = (*((pVVar4->typename_)._M_t.
               super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
               .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl)->_vptr_Typename
              [4])();
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,*(char **)CONCAT44(extraout_var,iVar2),
                        ((undefined8 *)CONCAT44(extraout_var,iVar2))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
  }
  std::__cxx11::string::erase((ulong)&this->m_ident,0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitEnumStmt(EnumStmt &stmt) {
        std::stringstream s;
        s << "(Stmt::Enum " << stmt.name.lexeme << " (";

        s << ") (\n";
        m_ident += "    ";

        for (const EnumStmt::Variant& variant : stmt.variants) {
            s << m_ident << "(" << variant.name.lexeme << " " << variant.typename_->name() << ")\n";
        }

        m_ident.erase(0, 4);
        s << ")";

        return s.str();
    }